

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O2

int os_exit(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  uint __status;
  
  iVar1 = lua_type(L,1);
  if (iVar1 == 1) {
    iVar1 = lua_toboolean(L,1);
    __status = (uint)(iVar1 == 0);
  }
  else {
    lVar2 = luaL_optinteger(L,1,0);
    __status = (uint)lVar2;
  }
  iVar1 = lua_toboolean(L,2);
  if (iVar1 != 0) {
    lua_close(L);
  }
  if (L == (lua_State *)0x0) {
    return 0;
  }
  exit(__status);
}

Assistant:

static int os_exit (lua_State *L) {
  int status;
  if (lua_isboolean(L, 1))
    status = (lua_toboolean(L, 1) ? EXIT_SUCCESS : EXIT_FAILURE);
  else
    status = (int)luaL_optinteger(L, 1, EXIT_SUCCESS);
  if (lua_toboolean(L, 2))
    lua_close(L);
  if (L) exit(status);  /* 'if' to avoid warnings for unreachable 'return' */
  return 0;
}